

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O0

void variable_list_del(splev_var *varlist)

{
  splev_var *psVar1;
  long lVar2;
  long local_20;
  long idx;
  splev_var *tmp;
  splev_var *varlist_local;
  
  tmp = varlist;
  if (varlist != (splev_var *)0x0) {
    while (tmp != (splev_var *)0x0) {
      free(tmp->name);
      if ((tmp->svtyp & 0x40U) == 0) {
        if ((tmp->data).value == (opvar *)0x0) {
          impossible("opvar_free(), %s","variable_list_del");
        }
        else {
          opvar_free_x((tmp->data).value);
          (tmp->data).value = (opvar *)0x0;
        }
      }
      else {
        local_20 = tmp->array_len;
        while (lVar2 = local_20 + -1, 0 < local_20) {
          local_20 = lVar2;
          if (*(long *)((long)(tmp->data).value + lVar2 * 8) == 0) {
            impossible("opvar_free(), %s","variable_list_del");
          }
          else {
            opvar_free_x(*(opvar **)((long)(tmp->data).value + lVar2 * 8));
            *(undefined8 *)((long)(tmp->data).value + lVar2 * 8) = 0;
          }
        }
        free((tmp->data).value);
      }
      psVar1 = tmp->next;
      free(tmp);
      tmp = psVar1;
    }
  }
  return;
}

Assistant:

static void variable_list_del(struct splev_var *varlist)
{
	struct splev_var *tmp = varlist;

	if (!tmp) return;

	while (tmp) {
	    free(tmp->name);
	    if (tmp->svtyp & SPOVAR_ARRAY) {
		long idx = tmp->array_len;
		while (idx-- > 0)
		    opvar_free(tmp->data.arrayvalues[idx]);
		free(tmp->data.arrayvalues);
	    } else {
		opvar_free(tmp->data.value);
	    }
	    tmp = varlist->next;
	    free(varlist);
	    varlist = tmp;
	}
}